

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_stream_split_decoder.cpp
# Opt level: O0

void __thiscall
duckdb::ByteStreamSplitDecoder::Read
          (ByteStreamSplitDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,
          idx_t result_offset)

{
  long *plVar1;
  ResizeableBuffer *this_00;
  ParquetColumnSchema *pPVar2;
  runtime_error *this_01;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ResizeableBuffer *in_RDI;
  ColumnReader *in_R8;
  Allocator *allocator;
  idx_t valid_count;
  uint32_t in_stack_000001b4;
  data_ptr_t in_stack_000001b8;
  BssDecoder *in_stack_000001c0;
  uint64_t in_stack_ffffffffffffffc0;
  idx_t in_stack_ffffffffffffffc8;
  Allocator *allocator_00;
  uint8_t *in_stack_ffffffffffffffd0;
  
  this_00 = (ResizeableBuffer *)
            ColumnReader::GetValidCount
                      (in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffc0);
  allocator_00 = *(Allocator **)(*(long *)((in_RDI->super_ByteBuffer).ptr + 0x10) + 0x118);
  ResizeableBuffer::reset(in_RDI);
  pPVar2 = ColumnReader::Schema((ColumnReader *)(in_RDI->super_ByteBuffer).ptr);
  if (pPVar2->parquet_type == FLOAT) {
    ResizeableBuffer::resize(this_00,allocator_00,in_stack_ffffffffffffffc0);
    unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::operator->
              ((unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true> *)
               in_RDI);
    BssDecoder::GetBatch<float>(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4);
  }
  else {
    if (pPVar2->parquet_type != DOUBLE) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_01,"BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
      __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    ResizeableBuffer::resize(this_00,allocator_00,in_stack_ffffffffffffffc0);
    unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::operator->
              ((unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true> *)
               in_RDI);
    BssDecoder::GetBatch<double>(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4);
  }
  plVar1 = (long *)(in_RDI->super_ByteBuffer).ptr;
  (**(code **)(*plVar1 + 0x70))(plVar1,(in_RDI->super_ByteBuffer).len,in_RSI,in_RDX,in_R8,in_RCX);
  return;
}

Assistant:

void ByteStreamSplitDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	idx_t valid_count = reader.GetValidCount(defines, read_count, result_offset);

	auto &allocator = reader.reader.allocator;
	decoded_data_buffer.reset();
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::FLOAT:
		decoded_data_buffer.resize(allocator, sizeof(float) * valid_count);
		bss_decoder->GetBatch<float>(decoded_data_buffer.ptr, valid_count);
		break;
	case duckdb_parquet::Type::DOUBLE:
		decoded_data_buffer.resize(allocator, sizeof(double) * valid_count);
		bss_decoder->GetBatch<double>(decoded_data_buffer.ptr, valid_count);
		break;
	default:
		throw std::runtime_error("BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
	}

	reader.Plain(decoded_data_buffer, defines, read_count, result_offset, result);
}